

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void ThreadContext::GlobalInitialize(void)

{
  PropertyRecord *this;
  charcount_t length;
  hash_t hash;
  char16 *s;
  uint local_c;
  int i;
  
  for (local_c = 0; local_c < 0x2c9; local_c = local_c + 1) {
    this = builtInPropertyRecords[(int)local_c];
    s = Js::PropertyRecord::GetBuffer(builtInPropertyRecords[(int)local_c]);
    length = Js::PropertyRecord::GetLength(builtInPropertyRecords[(int)local_c]);
    hash = JsUtil::CharacterBuffer<char16_t>::StaticGetHashCode(s,length);
    Js::PropertyRecord::SetHash(this,hash);
  }
  return;
}

Assistant:

void ThreadContext::GlobalInitialize()
{
    for (int i = 0; i < _countof(builtInPropertyRecords); i++)
    {
        builtInPropertyRecords[i]->SetHash(JsUtil::CharacterBuffer<WCHAR>::StaticGetHashCode(builtInPropertyRecords[i]->GetBuffer(), builtInPropertyRecords[i]->GetLength()));
    }
}